

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::SchemaElement::write(SchemaElement *this,int __fd,void *__buf,size_t __n)

{
  _SchemaElement__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"SchemaElement");
  _Var1 = this->__isset;
  if (((ushort)_Var1 & 1) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"type",8,1);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->type);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((ushort)_Var1 & 2) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"type_length",8,2);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->type_length);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((ushort)_Var1 & 4) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"repetition_type",8,3);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->repetition_type);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"name",0xb,4);
  iVar4 = (*this_00->_vptr_TProtocol[0x15])(this_00,&this->name);
  iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
  _Var1 = this->__isset;
  if (((ushort)_Var1 & 8) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"num_children",8,5);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->num_children);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((ushort)_Var1 & 0x10) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"converted_type",8,6);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->converted_type);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((ushort)_Var1 & 0x20) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"scale",8,7);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->scale);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((ushort)_Var1 & 0x40) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"precision",8,8);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->precision);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (_Var1._0_1_ < '\0') {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"field_id",8,9);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->field_id);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((ushort)_Var1 >> 8 & 1) != 0) {
    __n_00 = 10;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"logicalType",0xc);
    sVar6 = LogicalType::write(&this->logicalType,__fd,__buf_00,__n_00);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar6 + iVar4 + iVar3 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t SchemaElement::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SchemaElement");

  if (this->__isset.type) {
    xfer += oprot->writeFieldBegin("type", ::apache::thrift::protocol::T_I32, 1);
    xfer += oprot->writeI32(static_cast<int32_t>(this->type));
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.type_length) {
    xfer += oprot->writeFieldBegin("type_length", ::apache::thrift::protocol::T_I32, 2);
    xfer += oprot->writeI32(this->type_length);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.repetition_type) {
    xfer += oprot->writeFieldBegin("repetition_type", ::apache::thrift::protocol::T_I32, 3);
    xfer += oprot->writeI32(static_cast<int32_t>(this->repetition_type));
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldBegin("name", ::apache::thrift::protocol::T_STRING, 4);
  xfer += oprot->writeString(this->name);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.num_children) {
    xfer += oprot->writeFieldBegin("num_children", ::apache::thrift::protocol::T_I32, 5);
    xfer += oprot->writeI32(this->num_children);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.converted_type) {
    xfer += oprot->writeFieldBegin("converted_type", ::apache::thrift::protocol::T_I32, 6);
    xfer += oprot->writeI32(static_cast<int32_t>(this->converted_type));
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.scale) {
    xfer += oprot->writeFieldBegin("scale", ::apache::thrift::protocol::T_I32, 7);
    xfer += oprot->writeI32(this->scale);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.precision) {
    xfer += oprot->writeFieldBegin("precision", ::apache::thrift::protocol::T_I32, 8);
    xfer += oprot->writeI32(this->precision);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.field_id) {
    xfer += oprot->writeFieldBegin("field_id", ::apache::thrift::protocol::T_I32, 9);
    xfer += oprot->writeI32(this->field_id);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.logicalType) {
    xfer += oprot->writeFieldBegin("logicalType", ::apache::thrift::protocol::T_STRUCT, 10);
    xfer += this->logicalType.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}